

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ListBoxHeader(char *label,ImVec2 *size_arg)

{
  ImVec2 IVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  ImGuiContext *g;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImRect bb;
  float local_68;
  float fStack_64;
  ImVec2 local_50;
  ImRect local_48;
  ImRect local_38;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    id = GetID(label);
    IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
    IVar1 = *size_arg;
    fVar7 = CalcItemWidth();
    fVar8 = GetTextLineHeightWithSpacing();
    IVar1 = CalcItemSize(IVar1,fVar7,fVar8 * 7.4 + (pIVar4->Style).ItemSpacing.y);
    local_68 = IVar3.x;
    fStack_64 = IVar3.y;
    uVar6 = -(uint)(fStack_64 <= IVar1.y);
    local_48.Min = (pIVar2->DC).CursorPos;
    fVar7 = 0.0;
    fVar8 = local_48.Min.x;
    fVar10 = IVar1.x + fVar8;
    fVar9 = local_48.Min.y;
    fVar11 = (float)(uVar6 & (uint)IVar1.y | ~uVar6 & (uint)fStack_64) + fVar9;
    if (0.0 < local_68) {
      fVar7 = (pIVar4->Style).ItemInnerSpacing.x + local_68;
    }
    local_48.Max.y = fVar11 + 0.0;
    local_48.Max.x = fVar7 + fVar10;
    (pIVar2->DC).LastItemRect.Min = local_48.Min;
    (pIVar2->DC).LastItemRect.Max = local_48.Max;
    (pIVar4->NextItemData).Flags = 0;
    local_38.Min = local_48.Min;
    local_38.Max.x = fVar10;
    local_38.Max.y = fVar11;
    bVar5 = IsRectVisible(&local_48.Min,&local_48.Max);
    if (bVar5) {
      BeginGroup();
      if (0.0 < local_68) {
        IVar1.y = (pIVar4->Style).FramePadding.y + fVar9;
        IVar1.x = (pIVar4->Style).ItemInnerSpacing.x + fVar10;
        RenderText(IVar1,label,(char *)0x0,true);
      }
      local_50.y = fVar11 - fVar9;
      local_50.x = fVar10 - fVar8;
      BeginChildFrame(id,&local_50,0);
    }
    else {
      local_50.x = local_48.Max.x - local_48.Min.x;
      local_50.y = local_48.Max.y - local_48.Min.y;
      ItemSize(&local_50,(pIVar4->Style).FramePadding.y);
      ItemAdd(&local_48,0,&local_38);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.4f + style.ItemSpacing.y);
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    window->DC.LastItemRect = bb; // Forward storage for ListBoxFooter.. dodgy.
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    BeginGroup();
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}